

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O0

void api_suite::api_ctor_default(void)

{
  undefined4 local_64;
  size_type local_60;
  undefined4 local_54;
  size_type local_50 [2];
  undefined1 local_40 [8];
  map_array<int,_int,_4UL,_std::less<int>_> array;
  
  vista::map_array<int,_int,_4UL,_std::less<int>_>::map_array
            ((map_array<int,_int,_4UL,_std::less<int>_> *)local_40);
  local_50[0] = vista::map_view<int,_int,_4UL,_std::less<int>_>::size
                          ((map_view<int,_int,_4UL,_std::less<int>_> *)
                           (array.super_array<vista::pair<int,_int>,_4UL>._M_elems + 3));
  local_54 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x29,"void api_suite::api_ctor_default()",local_50,&local_54);
  local_60 = vista::map_view<int,_int,_4UL,_std::less<int>_>::capacity
                       ((map_view<int,_int,_4UL,_std::less<int>_> *)
                        (array.super_array<vista::pair<int,_int>,_4UL>._M_elems + 3));
  local_64 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("array.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x2a,"void api_suite::api_ctor_default()",&local_60,&local_64);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}